

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_change_event_add_hton_u8_Test::~Buffer_change_event_add_hton_u8_Test
          (Buffer_change_event_add_hton_u8_Test *this)

{
  Buffer_change_event_add_hton_u8_Test *this_local;
  
  ~Buffer_change_event_add_hton_u8_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, change_event_add_hton_u8) {
    BufferWithReadonlyStrings local;
    auto constexpr addme = uint8_t { 128 };
    auto constexpr size = sizeof(addme);
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = size,
        .n_deleted = 0
    };

    local.start_listening_to_changes();
    EXPECT_EQ(0, bfy_buffer_add_hton_u8(&local.buf, addme));
    EXPECT_EQ(changes_t{expected}, local.changes);
}